

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_set_phseg_dir(char *dir)

{
  int iVar1;
  char *pcVar2;
  char *tt;
  char *dir_local;
  
  requires_phseg = 1;
  pcVar2 = strrchr(dir,0x2c);
  if (pcVar2 == (char *)0x0) {
    is_flat[4] = 0;
  }
  else {
    iVar1 = strcmp(pcVar2 + 1,"FLAT");
    if (iVar1 == 0) {
      is_flat[4] = 1;
      *pcVar2 = '\0';
    }
    else {
      iVar1 = strcmp(pcVar2 + 1,"CTL");
      if (iVar1 == 0) {
        is_flat[4] = 0;
        *pcVar2 = '\0';
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                ,0x30b,"Assuming \',\' in phseg dir is part of a pathname\n");
        is_flat[4] = 0;
      }
    }
  }
  data_dir[4] = dir;
  return 0;
}

Assistant:

int
corpus_set_phseg_dir(const char *dir)
{
    char *tt;

    requires_phseg = TRUE;

    tt = strrchr(dir, ',');
    if (tt != NULL) {
	if (strcmp(tt+1, "FLAT") == 0) {
	    is_flat[DATA_TYPE_PHSEG] = TRUE;
	    *tt = '\0';
	}
	else if (strcmp(tt+1, "CTL") == 0) {
	    is_flat[DATA_TYPE_PHSEG] = FALSE;
	    *tt = '\0';
	}
	else {
	    E_INFO("Assuming ',' in phseg dir is part of a pathname\n");
	    
	    is_flat[DATA_TYPE_PHSEG] = FALSE;
	}
    }
    else {
	is_flat[DATA_TYPE_PHSEG] = FALSE;
    }

    data_dir[DATA_TYPE_PHSEG] = dir;

    return S3_SUCCESS;
}